

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Admin.h
# Opt level: O1

void __thiscall Admin::resizePersons(Admin *this)

{
  undefined1 auVar1 [16];
  University *pUVar2;
  Person *pPVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Person *pPVar9;
  undefined8 *puVar10;
  ulong uVar11;
  undefined8 *puVar12;
  byte bVar13;
  
  pUVar2 = Innopolis;
  bVar13 = 0;
  lVar8 = (long)Innopolis->persons_count;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lVar8 * 2;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x60),8) == 0) {
    uVar11 = SUB168(auVar1 * ZEXT816(0x60),0);
  }
  pPVar3 = (Person *)operator_new__(uVar11);
  if (lVar8 != 0) {
    pPVar9 = pPVar3;
    do {
      pPVar9->_vptr_Person = (_func_int **)&PTR_CheckPassword_00108d98;
      pPVar9->gender = true;
      pPVar9->id = 0;
      pPVar9->access_level = 0;
      pPVar9->num_groups = 0;
      piVar4 = (int *)operator_new__(0);
      pPVar9->groups = piVar4;
      pPVar9 = pPVar9 + 1;
    } while (pPVar9 != pPVar3 + lVar8 * 2);
  }
  iVar5 = pUVar2->persons_count;
  if (0 < iVar5) {
    lVar8 = 8;
    lVar7 = 0;
    do {
      puVar10 = (undefined8 *)((long)&pUVar2->persons->_vptr_Person + lVar8);
      puVar12 = (undefined8 *)((long)&pPVar3->_vptr_Person + lVar8);
      for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar12 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
        puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
      }
      lVar7 = lVar7 + 1;
      iVar5 = pUVar2->persons_count;
      lVar8 = lVar8 + 0x60;
    } while (lVar7 < iVar5);
  }
  pUVar2->persons_count = iVar5 * 2;
  pUVar2->persons = pPVar3;
  return;
}

Assistant:

void resizePersons(){
        Person* resizesPersonList = new Person[Innopolis->persons_count*2];
        for(int i=0;i<Innopolis->persons_count;i++){
            resizesPersonList[i] = Innopolis->persons[i];
        }
        Innopolis->persons_count<<=1;
        Innopolis->persons = resizesPersonList;
    }